

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_loadi(ASMState *as,Reg r,int32_t i)

{
  MCode *pMVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  
  bVar2 = (byte)r;
  if (i == 0) {
    pbVar3 = as->mcp;
    if ((*pbVar3 == 0xf) || ((*pbVar3 & 0xf0) != 0x70)) {
      pbVar3[-1] = (bVar2 & 7) + bVar2 * '\b' | 0xc0;
      pbVar3[-2] = 0x33;
      uVar4 = r >> 3 & 1 | r >> 1 & 0x104;
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + -2;
      }
      else {
        pbVar3[-3] = (byte)uVar4 | (byte)(r >> 0x10) | 0x40;
        pbVar3 = pbVar3 + -3;
      }
      goto LAB_0013c5a6;
    }
  }
  pMVar1 = as->mcp;
  *(int32_t *)(pMVar1 + -4) = i;
  pMVar1[-5] = bVar2 & 7 | 0xb8;
  if ((r & 8) == 0) {
    pbVar3 = pMVar1 + -5;
  }
  else {
    pMVar1[-6] = 'A';
    pbVar3 = pMVar1 + -6;
  }
LAB_0013c5a6:
  as->mcp = pbVar3;
  return;
}

Assistant:

static void emit_loadi(ASMState *as, Reg r, int32_t i)
{
  /* XOR r,r is shorter, but modifies the flags. This is bad for HIOP/jcc. */
  if (i == 0 && !(LJ_32 && (IR(as->curins)->o == IR_HIOP ||
			    (as->curins+1 < as->T->nins &&
			     IR(as->curins+1)->o == IR_HIOP))) &&
		!((*as->mcp == 0x0f && (as->mcp[1] & 0xf0) == XI_JCCn) ||
		  (*as->mcp & 0xf0) == XI_JCCs)) {
    emit_rr(as, XO_ARITH(XOg_XOR), r, r);
  } else {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = i;
    p[-5] = (MCode)(XI_MOVri+(r&7));
    p -= 5;
    REXRB(p, 0, r);
    as->mcp = p;
  }
}